

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SameLine(float offset_from_start_x,float spacing_w)

{
  ImGuiWindow *pIVar1;
  float fVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  if (pIVar1->SkipItems == false) {
    if ((offset_from_start_x != 0.0) || (NAN(offset_from_start_x))) {
      fVar2 = 0.0;
      if (0.0 <= spacing_w) {
        fVar2 = spacing_w;
      }
      fVar2 = ((pIVar1->Pos).x - (pIVar1->Scroll).x) + offset_from_start_x + fVar2 +
              (pIVar1->DC).GroupOffset.x + (pIVar1->DC).ColumnsOffset.x;
    }
    else {
      if (spacing_w < 0.0) {
        spacing_w = (GImGui->Style).ItemSpacing.x;
      }
      fVar2 = spacing_w + (pIVar1->DC).CursorPosPrevLine.x;
    }
    (pIVar1->DC).CursorPos.x = fVar2;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrLineSize = (pIVar1->DC).PrevLineSize;
    (pIVar1->DC).CurrLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
    (pIVar1->DC).IsSameLine = true;
  }
  return;
}

Assistant:

void ImGui::SameLine(float offset_from_start_x, float spacing_w)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    if (offset_from_start_x != 0.0f)
    {
        if (spacing_w < 0.0f)
            spacing_w = 0.0f;
        window->DC.CursorPos.x = window->Pos.x - window->Scroll.x + offset_from_start_x + spacing_w + window->DC.GroupOffset.x + window->DC.ColumnsOffset.x;
        window->DC.CursorPos.y = window->DC.CursorPosPrevLine.y;
    }
    else
    {
        if (spacing_w < 0.0f)
            spacing_w = g.Style.ItemSpacing.x;
        window->DC.CursorPos.x = window->DC.CursorPosPrevLine.x + spacing_w;
        window->DC.CursorPos.y = window->DC.CursorPosPrevLine.y;
    }
    window->DC.CurrLineSize = window->DC.PrevLineSize;
    window->DC.CurrLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    window->DC.IsSameLine = true;
}